

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int32 invert(float32 **ainv,float32 **a,int32 n)

{
  undefined8 *tmpptr;
  ulong uVar1;
  ulong uVar2;
  size_t d1;
  char uplo;
  int32 n_local;
  int32 nrhs;
  int32 info;
  
  d1 = (size_t)n;
  n_local = n;
  tmpptr = (undefined8 *)
           __ckd_calloc_2d__(d1,d1,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/matrix.c"
                             ,0xd3);
  memcpy((void *)*tmpptr,*a,(ulong)(uint)(n * n) << 2);
  uVar2 = 0;
  memset(*ainv,0,d1 * d1 * 4);
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    ainv[uVar2][uVar2] = 1.0;
  }
  uplo = 'L';
  nrhs = n;
  sposv_(&uplo,&n_local,&nrhs,(real *)*tmpptr,&n_local,(real *)*ainv,&n_local,&info);
  ckd_free_2d(tmpptr);
  return -(uint)(info != 0);
}

Assistant:

int32
invert(float32 ** ainv, float32 ** a, int32 n)
{
    char uplo;
    float32 **tmp_a;
    int32 info, nrhs, i;

    /* a is assumed to be symmetric, so we don't need to switch the
     * ordering of the data.  But we do need to copy it since it is
     * overwritten by LAPACK. */
    tmp_a = (float32 **)ckd_calloc_2d(n, n, sizeof(float32));
    memcpy(tmp_a[0], a[0], n*n*sizeof(float32));

    /* Construct an identity matrix. */
    memset(ainv[0], 0, sizeof(float32) * n * n);
    for (i = 0; i < n; i++)
        ainv[i][i] = 1.0;

    uplo = 'L';
    nrhs = n;
    sposv_(&uplo, &n, &nrhs, tmp_a[0], &n, ainv[0], &n, &info);

    ckd_free_2d((void **)tmp_a);

    if (info != 0)
	return -1;
    else
	return info;
}